

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void deqp::egl::Image::initializeDepthRbo(Functions *gl,GLuint rbo,Texture2D *ref)

{
  glScissorFunc p_Var1;
  GLenum GVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  PixelBufferAccess *pPVar8;
  PixelBufferAccess local_60;
  Vector<int,_2> local_34;
  IVec2 size;
  float depth;
  int ndx;
  int NUM_STEPS;
  Texture2D *ref_local;
  GLuint rbo_local;
  Functions *gl_local;
  
  do {
    (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,rbo);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x18e);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    (*gl->clearDepthf)(0.0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"clearDepthf(0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,400);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    (*gl->clear)(0x100);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"clear(GL_DEPTH_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x191);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  pPVar8 = tcu::TextureLevelPyramid::getLevel(&ref->super_TextureLevelPyramid,0);
  tcu::clearDepth(pPVar8,0.0);
  do {
    (*gl->enable)(0xc11);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"enable(GL_SCISSOR_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x195);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  for (size.m_data[1] = 0; size.m_data[1] < 0xd; size.m_data[1] = size.m_data[1] + 1) {
    size.m_data[0] = (int)((float)size.m_data[1] / 13.0);
    iVar4 = 0xd - size.m_data[1];
    iVar5 = tcu::Texture2D::getWidth(ref);
    iVar6 = 0xd - size.m_data[1];
    iVar7 = tcu::Texture2D::getHeight(ref);
    tcu::Vector<int,_2>::Vector
              (&local_34,(int)((float)iVar4 * ((float)iVar5 / 13.0)),
               (int)((float)iVar6 * ((float)iVar7 / 17.0)));
    iVar4 = tcu::Vector<int,_2>::x(&local_34);
    if ((iVar4 == 0) || (iVar4 = tcu::Vector<int,_2>::y(&local_34), iVar4 == 0)) break;
    do {
      p_Var1 = gl->scissor;
      iVar4 = tcu::Vector<int,_2>::x(&local_34);
      iVar5 = tcu::Vector<int,_2>::y(&local_34);
      (*p_Var1)(0,0,iVar4,iVar5);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"scissor(0, 0, size.x(), size.y())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x19f);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      (*gl->clearDepthf)((GLfloat)size.m_data[0]);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"clearDepthf(depth)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x1a0);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      (*gl->clear)(0x100);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"clear(GL_DEPTH_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x1a1);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pPVar8 = tcu::TextureLevelPyramid::getLevel(&ref->super_TextureLevelPyramid,0);
    iVar4 = tcu::Vector<int,_2>::x(&local_34);
    iVar5 = tcu::Vector<int,_2>::y(&local_34);
    tcu::getSubregion(&local_60,pPVar8,0,0,iVar4,iVar5);
    tcu::clearDepth(&local_60,(float)size.m_data[0]);
  }
  do {
    (*gl->disable)(0xc11);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"disable(GL_SCISSOR_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1a6);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1a8);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  return;
}

Assistant:

void initializeDepthRbo(const glw::Functions& gl, GLuint rbo, Texture2D& ref)
{
	const int NUM_STEPS = 13;

	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,
												   GL_RENDERBUFFER, rbo));

	GLU_CHECK_GLW_CALL(gl, clearDepthf(0.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_DEPTH_BUFFER_BIT));
	tcu::clearDepth(ref.getLevel(0), 0.0f);

	// create a pattern
	GLU_CHECK_GLW_CALL(gl, enable(GL_SCISSOR_TEST));
	for (int ndx = 0; ndx < NUM_STEPS; ++ndx)
	{
		const float			depth	= (float)ndx / float(NUM_STEPS);
		const tcu::IVec2	size	= tcu::IVec2((int)((float)(NUM_STEPS - ndx) * ((float)ref.getWidth() / float(NUM_STEPS))),
												 (int)((float)(NUM_STEPS - ndx) * ((float)ref.getHeight() / float(NUM_STEPS + 4)))); // not symmetric

		if (size.x() == 0 || size.y() == 0)
			break;

		GLU_CHECK_GLW_CALL(gl, scissor(0, 0, size.x(), size.y()));
		GLU_CHECK_GLW_CALL(gl, clearDepthf(depth));
		GLU_CHECK_GLW_CALL(gl, clear(GL_DEPTH_BUFFER_BIT));

		tcu::clearDepth(tcu::getSubregion(ref.getLevel(0), 0, 0, size.x(), size.y()), depth);
	}

	GLU_CHECK_GLW_CALL(gl, disable(GL_SCISSOR_TEST));
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,
												   GL_RENDERBUFFER, 0));

}